

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void EnableOrDisableLogCategories(UniValue *cats,bool enable)

{
  pointer pcVar1;
  bool bVar2;
  UniValue *pUVar3;
  string *psVar4;
  Logger *pLVar5;
  ulong uVar6;
  uint uVar7;
  size_t index;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string cat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pUVar3 = UniValue::get_array(cats);
  cats->typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&cats->val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&cats->keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&cats->values,&pUVar3->values);
  if ((cats->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (cats->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar7 = 1;
    index = 0;
    do {
      pUVar3 = UniValue::operator[](cats,index);
      psVar4 = UniValue::get_str_abi_cxx11_(pUVar3);
      pcVar1 = (psVar4->_M_dataplus)._M_p;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar1,pcVar1 + psVar4->_M_string_length);
      if (enable) {
        pLVar5 = LogInstance();
        str._M_str = local_58._M_dataplus._M_p;
        str._M_len = local_58._M_string_length;
        bVar2 = BCLog::Logger::EnableCategory(pLVar5,str);
      }
      else {
        pLVar5 = LogInstance();
        str_00._M_str = local_58._M_dataplus._M_p;
        str_00._M_len = local_58._M_string_length;
        bVar2 = BCLog::Logger::DisableCategory(pLVar5,str_00);
      }
      if (bVar2 == false) {
        pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
        std::operator+(&bStack_78,"unknown logging category ",&local_58);
        JSONRPCError(pUVar3,-8,&bStack_78);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_003661cd;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      index = (size_t)uVar7;
      uVar6 = ((long)(cats->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(cats->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
      uVar7 = uVar7 + 1;
    } while (index <= uVar6 && uVar6 - index != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003661cd:
  __stack_chk_fail();
}

Assistant:

static void EnableOrDisableLogCategories(UniValue cats, bool enable) {
    cats = cats.get_array();
    for (unsigned int i = 0; i < cats.size(); ++i) {
        std::string cat = cats[i].get_str();

        bool success;
        if (enable) {
            success = LogInstance().EnableCategory(cat);
        } else {
            success = LogInstance().DisableCategory(cat);
        }

        if (!success) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "unknown logging category " + cat);
        }
    }
}